

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void check_boundary(Terminal *term,wchar_t x,wchar_t y)

{
  undefined4 uVar1;
  termline *line;
  termchar *ptVar2;
  termchar *ptVar3;
  termline *ldata;
  wchar_t y_local;
  wchar_t x_local;
  Terminal *term_local;
  
  if ((L'\0' < x) && (x <= term->cols)) {
    line = lineptr(term,y,L'૑',L'\x01');
    check_trust_status(term,line);
    check_line_size(term,line);
    if (x == term->cols) {
      line->lattr = line->lattr & 0xffdf;
    }
    else if (line->chars[x].chr == 0xdfff) {
      clear_cc(line,x + L'\xffffffff');
      clear_cc(line,x);
      line->chars[x + L'\xffffffff'].chr = 0xd820;
      ptVar2 = line->chars + x;
      ptVar3 = line->chars + (x + L'\xffffffff');
      ptVar2->chr = ptVar3->chr;
      ptVar2->attr = ptVar3->attr;
      ptVar2->truecolour = ptVar3->truecolour;
      uVar1 = *(undefined4 *)&ptVar3->field_0x1c;
      ptVar2->cc_next = ptVar3->cc_next;
      *(undefined4 *)&ptVar2->field_0x1c = uVar1;
    }
  }
  return;
}

Assistant:

static void check_boundary(Terminal *term, int x, int y)
{
    termline *ldata;

    /* Validate input coordinates, just in case. */
    if (x <= 0 || x > term->cols)
        return;

    ldata = scrlineptr(y);
    check_trust_status(term, ldata);
    check_line_size(term, ldata);
    if (x == term->cols) {
        ldata->lattr &= ~LATTR_WRAPPED2;
    } else {
        if (ldata->chars[x].chr == UCSWIDE) {
            clear_cc(ldata, x-1);
            clear_cc(ldata, x);
            ldata->chars[x-1].chr = ' ' | CSET_ASCII;
            ldata->chars[x] = ldata->chars[x-1];
        }
    }
}